

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

char * __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,XMLCh *toTranscode,MemoryManager *manager)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar4;
  undefined1 auVar5 [16];
  UErrorCode err;
  XMLMutexLock lockConverter;
  ArrayJanitor<char16_t> janTmp;
  char *pcVar3;
  
  if (toTranscode == (XMLCh *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else if (*toTranscode == L'\0') {
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,1);
    pcVar3 = (char *)CONCAT44(extraout_var_01,iVar1);
    *pcVar3 = '\0';
  }
  else {
    XVar2 = XMLString::stringLen(toTranscode);
    ArrayJanitor<char16_t>::ArrayJanitor(&janTmp,(char16_t *)0x0,manager);
    auVar5._8_4_ = (int)(XVar2 >> 0x20);
    auVar5._0_8_ = XVar2;
    auVar5._12_4_ = 0x45300000;
    iVar4 = (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)XVar2) - 4503599627370496.0)) * 1.25) + 1;
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,(long)iVar4);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
    err = U_ZERO_ERROR;
    XMLMutexLock::XMLMutexLock(&lockConverter,&this->fMutex);
    iVar1 = ucnv_fromUChars_70(this->fConverter,pcVar3,iVar4,toTranscode,0xffffffffffffffff,&err);
    XMLMutexLock::~XMLMutexLock(&lockConverter);
    if ((err == U_BUFFER_OVERFLOW_ERROR) || (err == U_STRING_NOT_TERMINATED_WARNING)) {
      err = U_ZERO_ERROR;
      (*manager->_vptr_MemoryManager[4])(manager,pcVar3);
      iVar4 = (*manager->_vptr_MemoryManager[3])(manager,(long)(iVar1 + 1));
      pcVar3 = (char *)CONCAT44(extraout_var_00,iVar4);
      XMLMutexLock::XMLMutexLock(&lockConverter,&this->fMutex);
      ucnv_fromUChars_70(this->fConverter,pcVar3,iVar1 + 1,toTranscode,0xffffffffffffffff,&err);
      XMLMutexLock::~XMLMutexLock(&lockConverter);
    }
    if (U_ZERO_ERROR < err) {
      (*manager->_vptr_MemoryManager[4])(manager,pcVar3);
      pcVar3 = (char *)0x0;
    }
    ArrayJanitor<char16_t>::~ArrayJanitor(&janTmp);
  }
  return pcVar3;
}

Assistant:

char* ICULCPTranscoder::transcode(const XMLCh* const toTranscode,
                                  MemoryManager* const manager)
{
    char* retBuf = 0;

    // Check for a couple of special cases
    if (!toTranscode)
        return retBuf;

    if (!*toTranscode)
    {
        retBuf = (char*) manager->allocate(sizeof(char));//new char[1];
        retBuf[0] = 0;
        return retBuf;
    }

    //
    //  Get the length of the source string since we'll have to use it in
    //  a couple places below.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toTranscode);

    //
    //  If XMLCh and UChar are not the same size, then we have to make a
    //  temp copy of the text to pass to ICU.
    //
    const UChar* actualSrc;
    UChar* ncActual = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        actualSrc = (const UChar*)toTranscode;
    }
    else
    {
        // Allocate a non-const temp buf, but store it also in the actual
        ncActual = convertToUChar(toTranscode, 0, manager);
        actualSrc = ncActual;
    }

    // Insure that the temp buffer, if any, gets cleaned up via the nc pointer
    ArrayJanitor<UChar> janTmp(ncActual, manager);

    // Caculate a return buffer size not too big, but less likely to overflow
    int32_t targetLen = (int32_t)(srcLen * 1.25);

    // Allocate the return buffer
    retBuf = (char*) manager->allocate((targetLen + 1) * sizeof(char));//new char[targetLen + 1];

    //
    //  Lock now while we call the converter. Use a faux block to do the
    //  lock so that it unlocks immediately afterwards.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    {
        XMLMutexLock lockConverter(&fMutex);

        targetCap = ucnv_fromUChars
        (
            fConverter
            , retBuf
            , targetLen + 1
            , actualSrc
            , -1
            , &err
        );
    }

    // If targetLen is not enough then buffer overflow might occur
    if ((err == U_BUFFER_OVERFLOW_ERROR) || (err == U_STRING_NOT_TERMINATED_WARNING))
    {
        //
        //  Reset the error, delete the old buffer, allocate a new one,
        //  and try again.
        //
        err = U_ZERO_ERROR;
        manager->deallocate(retBuf);//delete [] retBuf;
        retBuf = (char*) manager->allocate((targetCap + 1) * sizeof(char));//new char[targetCap + 1];

        // Lock again before we retry
        XMLMutexLock lockConverter(&fMutex);
        targetCap = ucnv_fromUChars
        (
            fConverter
            , retBuf
            , targetCap + 1
            , actualSrc
            , -1
            , &err
        );
    }

    if (U_FAILURE(err))
    {
        manager->deallocate(retBuf);//delete [] retBuf;
        return 0;
    }

    return retBuf;
}